

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

Fts5Structure * fts5IndexOptimizeStruct(Fts5Index *p,Fts5Structure *pStruct)

{
  int iVar1;
  int iVar2;
  Fts5StructureSegment *pFVar3;
  bool bVar4;
  Fts5Structure *p_00;
  Fts5StructureSegment *pFVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  
  iVar1 = pStruct->nSegment;
  if (1 < (long)iVar1) {
    lVar8 = (long)pStruct->nLevel;
    if (0 < lVar8) {
      lVar7 = 0;
      do {
        iVar2 = *(int *)((long)&pStruct->aLevel[0].nSeg + lVar7);
        if ((iVar2 == iVar1) ||
           ((bVar4 = true, iVar2 == iVar1 + -1 &&
            (*(int *)((long)&pStruct->aLevel[0].nMerge + lVar7) == iVar2)))) {
          pStruct->nRef = pStruct->nRef + 1;
          bVar4 = false;
        }
        if (!bVar4) {
          return pStruct;
        }
        lVar7 = lVar7 + 0x10;
      } while (lVar8 << 4 != lVar7);
    }
    p_00 = (Fts5Structure *)sqlite3Fts5MallocZero(&p->rc,lVar8 * 0x10 + 0x38);
    if (p_00 != (Fts5Structure *)0x0) {
      p_00->nLevel = pStruct->nLevel + 1;
      p_00->nRef = 1;
      p_00->nWriteCounter = pStruct->nWriteCounter;
      iVar2 = pStruct->nLevel;
      pFVar5 = (Fts5StructureSegment *)sqlite3Fts5MallocZero(&p->rc,(long)iVar1 * 0xc);
      p_00->aLevel[iVar2].aSeg = pFVar5;
      if (pFVar5 != (Fts5StructureSegment *)0x0) {
        if (0 < (long)pStruct->nLevel) {
          iVar6 = 0;
          lVar8 = (long)pStruct->nLevel;
          do {
            if (0 < pStruct->aLevel[lVar8 + -1].nSeg) {
              lVar9 = 0;
              lVar7 = 0;
              do {
                pFVar5 = p_00->aLevel[iVar2].aSeg;
                pFVar3 = pStruct->aLevel[lVar8 + -1].aSeg;
                *(undefined4 *)((long)&pFVar5[iVar6].pgnoLast + lVar9) =
                     *(undefined4 *)((long)&pFVar3->pgnoLast + lVar9);
                *(undefined8 *)((long)&pFVar5[iVar6].iSegid + lVar9) =
                     *(undefined8 *)((long)&pFVar3->iSegid + lVar9);
                lVar7 = lVar7 + 1;
                lVar9 = lVar9 + 0xc;
              } while (lVar7 < pStruct->aLevel[lVar8 + -1].nSeg);
              iVar6 = iVar6 + (int)lVar7;
            }
            bVar4 = 1 < lVar8;
            lVar8 = lVar8 + -1;
          } while (bVar4);
        }
        p_00->aLevel[iVar2].nSeg = iVar1;
        p_00->nSegment = iVar1;
        return p_00;
      }
      sqlite3_free(p_00);
    }
  }
  return (Fts5Structure *)0x0;
}

Assistant:

static Fts5Structure *fts5IndexOptimizeStruct(
  Fts5Index *p, 
  Fts5Structure *pStruct
){
  Fts5Structure *pNew = 0;
  sqlite3_int64 nByte = sizeof(Fts5Structure);
  int nSeg = pStruct->nSegment;
  int i;

  /* Figure out if this structure requires optimization. A structure does
  ** not require optimization if either:
  **
  **  + it consists of fewer than two segments, or 
  **  + all segments are on the same level, or
  **  + all segments except one are currently inputs to a merge operation.
  **
  ** In the first case, return NULL. In the second, increment the ref-count
  ** on *pStruct and return a copy of the pointer to it.
  */
  if( nSeg<2 ) return 0;
  for(i=0; i<pStruct->nLevel; i++){
    int nThis = pStruct->aLevel[i].nSeg;
    if( nThis==nSeg || (nThis==nSeg-1 && pStruct->aLevel[i].nMerge==nThis) ){
      fts5StructureRef(pStruct);
      return pStruct;
    }
    assert( pStruct->aLevel[i].nMerge<=nThis );
  }

  nByte += (pStruct->nLevel+1) * sizeof(Fts5StructureLevel);
  pNew = (Fts5Structure*)sqlite3Fts5MallocZero(&p->rc, nByte);

  if( pNew ){
    Fts5StructureLevel *pLvl;
    nByte = nSeg * sizeof(Fts5StructureSegment);
    pNew->nLevel = pStruct->nLevel+1;
    pNew->nRef = 1;
    pNew->nWriteCounter = pStruct->nWriteCounter;
    pLvl = &pNew->aLevel[pStruct->nLevel];
    pLvl->aSeg = (Fts5StructureSegment*)sqlite3Fts5MallocZero(&p->rc, nByte);
    if( pLvl->aSeg ){
      int iLvl, iSeg;
      int iSegOut = 0;
      /* Iterate through all segments, from oldest to newest. Add them to
      ** the new Fts5Level object so that pLvl->aSeg[0] is the oldest
      ** segment in the data structure.  */
      for(iLvl=pStruct->nLevel-1; iLvl>=0; iLvl--){
        for(iSeg=0; iSeg<pStruct->aLevel[iLvl].nSeg; iSeg++){
          pLvl->aSeg[iSegOut] = pStruct->aLevel[iLvl].aSeg[iSeg];
          iSegOut++;
        }
      }
      pNew->nSegment = pLvl->nSeg = nSeg;
    }else{
      sqlite3_free(pNew);
      pNew = 0;
    }
  }

  return pNew;
}